

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmLocalGenerator *localGenerator;
  cmGeneratorTarget *pcVar2;
  cmGeneratorTarget *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  pointer pbVar6;
  int iVar7;
  cmPropertyMap *pcVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar10;
  string *psVar11;
  cmGeneratorExpressionInterpreter *this;
  ostream *poVar12;
  size_t sVar13;
  pointer ppcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string report;
  string reportEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  undefined1 local_3a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  cmGeneratorTarget *local_380;
  cmGeneratorExpressionInterpreter *local_378;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  undefined1 *local_348;
  long local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  string local_328;
  _Base_ptr local_308;
  _Base_ptr local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  char *local_2e8;
  size_type local_2e0;
  char local_2d8;
  undefined7 uStack_2d7;
  undefined8 uStack_2d0;
  string local_2c8;
  char *local_2a8;
  size_type local_2a0;
  char local_298;
  undefined7 uStack_297;
  undefined8 uStack_290;
  char *local_288;
  size_type local_280;
  char local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  string local_268;
  undefined1 local_248 [17];
  undefined7 uStack_237;
  undefined8 uStack_230;
  ios_base local_1d8 [264];
  char *local_d0;
  pointer local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  pcVar8 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_a8,pcVar8);
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar15 = _Var9._M_current !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_300 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_2f8 = local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_308 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2f0 = _Var9._M_current;
  if (local_300 != local_308 &&
      _Var9._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  local_380 = tgt;
  pvVar10 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar10->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar10->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370," * Target \"","");
    psVar11 = cmTarget::GetName_abi_cxx11_(local_380->Target);
    std::__cxx11::string::_M_append((char *)&local_370,(ulong)(psVar11->_M_dataplus)._M_p);
    local_350 = __return_storage_ptr__;
    if (local_2f0 != local_2f8) {
      std::__cxx11::string::append((char *)&local_370);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      if (local_288 == &local_278) {
        uStack_230 = uStack_270;
        local_288 = local_248 + 0x10;
      }
      uStack_237 = uStack_277;
      local_248[0x10] = local_278;
      local_248._8_8_ = local_280;
      local_280 = 0;
      local_278 = '\0';
      local_248._0_8_ = local_288;
      local_288 = &local_278;
      std::__cxx11::string::_M_append((char *)&local_370,local_248._0_8_);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_370);
    std::operator+(&local_50,"INTERFACE_",p);
    iVar7 = std::__cxx11::string::compare((char *)p);
    if (iVar7 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      pcVar2 = local_380;
      localGenerator = local_380->LocalGenerator;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,pcVar1,pcVar1 + config->_M_string_length);
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_268,pcVar2,&local_70);
      local_378 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_378 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    ppcVar14 = (pvVar10->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_c8 = (pvVar10->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar14 != local_c8) {
      bVar16 = local_300 != local_308;
      bVar17 = local_2f0 == local_2f8;
      do {
        pcVar2 = *ppcVar14;
        pcVar8 = cmTarget::GetProperties(pcVar2->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_c0,pcVar8);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar6 = local_c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>(&local_2c8,pcVar2,&local_50,local_378);
        pbVar4 = local_2f0;
        local_348 = &local_338;
        local_340 = 0;
        local_338 = 0;
        if (_Var9._M_current == pbVar6) {
          iVar7 = 3;
          if (bVar17 && bVar16) {
LAB_003545ca:
            local_90[0] = local_80;
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            local_248._8_8_ = 0;
            stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_248);
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            if (_Var9._M_current != pbVar6) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a8,__return_storage_ptr__,&local_2c8,t);
              std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_348);
              pcVar3 = local_380;
              sVar13 = __return_storage_ptr__->_M_string_length;
              bVar18 = true;
              if (sVar13 == local_3a8._16_8_) {
                if (sVar13 == 0) {
                  bVar18 = false;
                }
                else {
                  iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a8._8_8_,
                               sVar13);
                  bVar18 = iVar7 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar18);
              std::__cxx11::string::_M_append((char *)&local_370,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              if (local_3a8[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_248,"Property ",9);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is\nimplied to be ",0x13);
                pcVar5 = local_d0;
                if (local_d0 == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar13 = strlen(local_d0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar5,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," property on\ndependency \"",0x19);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_328);
                goto LAB_00354b21;
              }
              iVar7 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_00354b6d;
            }
            iVar7 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_348);
          psVar11 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
          std::__cxx11::string::_M_append((char *)&local_348,(ulong)(psVar11->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_348);
          local_2e8 = &local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e8,local_2c8._M_dataplus._M_p,
                     local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
          if (local_2e8 == &local_2d8) {
            uStack_230 = uStack_2d0;
            local_2e8 = local_248 + 0x10;
          }
          uStack_237 = uStack_2d7;
          local_248[0x10] = local_2d8;
          local_248._8_8_ = local_2e0;
          local_2e0 = 0;
          local_2d8 = '\0';
          local_248._0_8_ = local_2e8;
          local_2e8 = &local_2d8;
          std::__cxx11::string::_M_append((char *)&local_348,local_248._0_8_);
          __return_storage_ptr__ = local_350;
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
          }
          std::__cxx11::string::append((char *)&local_348);
          if (pbVar4 == local_2f8) {
            if (local_300 != local_308) goto LAB_003545ca;
            if (bVar15) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a8,__return_storage_ptr__,&local_2c8,t);
              std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_348);
              pcVar3 = local_380;
              sVar13 = __return_storage_ptr__->_M_string_length;
              bVar15 = true;
              if (sVar13 == local_3a8._16_8_) {
                if (sVar13 == 0) {
                  bVar15 = false;
                }
                else {
                  iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a8._8_8_,
                               sVar13);
                  bVar15 = iVar7 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar15);
              std::__cxx11::string::_M_append((char *)&local_370,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              if (local_3a8[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_248,"The INTERFACE_",0xe);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," property of \"",0xe);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" does\nnot agree with the value of ",0x23);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," already determined\nfor \"",0x19);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_328);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
                std::ios_base::~ios_base(local_1d8);
                iVar7 = 2;
              }
              else {
                iVar7 = 3;
                std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._8_8_ != &local_390) {
                operator_delete((void *)local_3a8._8_8_,local_390._0_8_ + 1);
              }
              bVar15 = true;
            }
            else {
              local_248._0_8_ = local_248 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_248,local_348,local_348 + local_340);
              std::__cxx11::string::append((char *)local_248);
              std::__cxx11::string::_M_append((char *)&local_370,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              iVar7 = 0;
              bVar15 = true;
            }
          }
          else {
            consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_3a8,__return_storage_ptr__,&local_2c8,t);
            std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_348);
            pcVar3 = local_380;
            sVar13 = __return_storage_ptr__->_M_string_length;
            bVar18 = true;
            if (sVar13 == local_3a8._16_8_) {
              if (sVar13 == 0) {
                bVar18 = false;
              }
              else {
                iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a8._8_8_,
                             sVar13);
                bVar18 = iVar7 != 0;
              }
            }
            compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar18);
            std::__cxx11::string::_M_append((char *)&local_370,local_248._0_8_);
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
            }
            if (local_3a8[0] == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_248,"Property ",9)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
              psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" does\nnot match the INTERFACE_",0x1f);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," property requirement\nof dependency \"",0x25);
              psVar11 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_328);
LAB_00354b21:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
              std::ios_base::~ios_base(local_1d8);
              iVar7 = 2;
            }
            else {
              iVar7 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
LAB_00354b6d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._8_8_ != &local_390) {
              operator_delete((void *)local_3a8._8_8_,local_390._0_8_ + 1);
            }
          }
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c0);
      } while (((iVar7 == 3) || (iVar7 == 0)) && (ppcVar14 = ppcVar14 + 1, ppcVar14 != local_c8));
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    if (local_2a8 == &local_298) {
      uStack_230 = uStack_290;
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._0_8_ = local_2a8;
    }
    uStack_237 = uStack_297;
    local_248[0x10] = local_298;
    local_248._8_8_ = local_2a0;
    local_2a0 = 0;
    local_298 = '\0';
    local_2a8 = &local_298;
    compatibilityType_abi_cxx11_((string *)local_3a8,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (local_380,p,(string *)local_248,&local_370,(string *)local_3a8);
    if ((undefined1 *)CONCAT71(local_3a8._1_7_,local_3a8[0]) != local_3a8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3a8._1_7_,local_3a8[0]),local_3a8._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
    }
    if (local_378 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_378,local_378);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}